

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O3

void __thiscall TimidityPPMIDIDevice::Stop(TimidityPPMIDIDevice *this)

{
  SoundStream *pSVar1;
  int iVar2;
  
  if ((this->super_PseudoMIDIDevice).Started == true) {
    pSVar1 = (this->super_PseudoMIDIDevice).Stream;
    if (pSVar1 != (SoundStream *)0x0) {
      (*pSVar1->_vptr_SoundStream[3])();
    }
    if (this->ChildProcess != -1) {
      iVar2 = kill(this->ChildProcess,0xf);
      if (iVar2 != 0) {
        kill(this->ChildProcess,9);
      }
      waitpid(this->ChildProcess,(int *)0x0,0);
      this->ChildProcess = -1;
    }
  }
  (this->super_PseudoMIDIDevice).Started = false;
  return;
}

Assistant:

void TimidityPPMIDIDevice::Stop ()
{
	if (Started)
	{
		if (Stream != NULL)
		{
			Stream->Stop();
		}
#ifdef _WIN32
		if (ChildProcess != INVALID_HANDLE_VALUE)
		{
			if (!SafeTerminateProcess(ChildProcess, 666) && GetLastError() != ERROR_PROCESS_ABORTED)
			{
				TerminateProcess(ChildProcess, 666);
			}
			CloseHandle(ChildProcess);
			ChildProcess = INVALID_HANDLE_VALUE;
		}
#else
		if (ChildProcess != -1)
		{
			if (kill(ChildProcess, SIGTERM) != 0)
			{
				kill(ChildProcess, SIGKILL);
			}
			waitpid(ChildProcess, NULL, 0);
			ChildProcess = -1;
		}
#endif
	}
	Started = false;
}